

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simSymSim.c
# Opt level: O0

void Sim_SymmsDeriveInfo(Sym_Man_t *p,uint *pPat,Abc_Obj_t *pNode,Vec_Ptr_t *vMatrsNonSym,int Output
                        )

{
  int iVar1;
  Extra_BitMat_t *p_00;
  Vec_Int_t *p_01;
  void *pvVar2;
  void *pvVar3;
  int local_5c;
  int local_58;
  int Index;
  int w;
  int i;
  uint *pSimInfo;
  uint *pSupport;
  Vec_Int_t *vSupport;
  Extra_BitMat_t *pMat;
  int Output_local;
  Vec_Ptr_t *vMatrsNonSym_local;
  Abc_Obj_t *pNode_local;
  uint *pPat_local;
  Sym_Man_t *p_local;
  
  p_00 = (Extra_BitMat_t *)Vec_PtrEntry(vMatrsNonSym,Output);
  p_01 = Vec_VecEntryInt(p->vSupports,Output);
  pvVar2 = Vec_PtrEntry(p->vSuppFun,Output);
  pvVar3 = Vec_PtrEntry(p->vSim,pNode->Id);
  for (local_58 = 0; local_58 < p->nSimWords; local_58 = local_58 + 1) {
    p->uPatCol[local_58] =
         *(uint *)((long)pvVar2 + (long)local_58 * 4) & pPat[local_58] &
         *(uint *)((long)pvVar3 + (long)local_58 * 4);
    p->uPatRow[local_58] =
         *(uint *)((long)pvVar2 + (long)local_58 * 4) & pPat[local_58] &
         (*(uint *)((long)pvVar3 + (long)local_58 * 4) ^ 0xffffffff);
  }
  for (local_5c = 0; iVar1 = Vec_IntSize(p_01), local_5c < iVar1; local_5c = local_5c + 1) {
    iVar1 = Vec_IntEntry(p_01,local_5c);
    if ((p->uPatCol[iVar1 >> 5] & 1 << ((byte)iVar1 & 0x1f)) != 0) {
      Extra_BitMatrixOr(p_00,iVar1,p->uPatRow);
    }
  }
  for (local_5c = 0; iVar1 = Vec_IntSize(p_01), local_5c < iVar1; local_5c = local_5c + 1) {
    iVar1 = Vec_IntEntry(p_01,local_5c);
    if ((p->uPatRow[iVar1 >> 5] & 1 << ((byte)iVar1 & 0x1f)) != 0) {
      Extra_BitMatrixOr(p_00,iVar1,p->uPatCol);
    }
  }
  for (local_58 = 0; local_58 < p->nSimWords; local_58 = local_58 + 1) {
    p->uPatCol[local_58] =
         *(uint *)((long)pvVar2 + (long)local_58 * 4) & (pPat[local_58] ^ 0xffffffff) &
         *(uint *)((long)pvVar3 + (long)local_58 * 4);
    p->uPatRow[local_58] =
         *(uint *)((long)pvVar2 + (long)local_58 * 4) & (pPat[local_58] ^ 0xffffffff) &
         (*(uint *)((long)pvVar3 + (long)local_58 * 4) ^ 0xffffffff);
  }
  for (local_5c = 0; iVar1 = Vec_IntSize(p_01), local_5c < iVar1; local_5c = local_5c + 1) {
    iVar1 = Vec_IntEntry(p_01,local_5c);
    if ((p->uPatCol[iVar1 >> 5] & 1 << ((byte)iVar1 & 0x1f)) != 0) {
      Extra_BitMatrixOr(p_00,iVar1,p->uPatRow);
    }
  }
  for (local_5c = 0; iVar1 = Vec_IntSize(p_01), local_5c < iVar1; local_5c = local_5c + 1) {
    iVar1 = Vec_IntEntry(p_01,local_5c);
    if ((p->uPatRow[iVar1 >> 5] & 1 << ((byte)iVar1 & 0x1f)) != 0) {
      Extra_BitMatrixOr(p_00,iVar1,p->uPatCol);
    }
  }
  return;
}

Assistant:

void Sim_SymmsDeriveInfo( Sym_Man_t * p, unsigned * pPat, Abc_Obj_t * pNode, Vec_Ptr_t * vMatrsNonSym, int Output )
{
    Extra_BitMat_t * pMat;
    Vec_Int_t * vSupport;
    unsigned * pSupport;
    unsigned * pSimInfo;
    int i, w, Index;
    // get the matrix, the support, and the simulation info
    pMat = (Extra_BitMat_t *)Vec_PtrEntry( vMatrsNonSym, Output );
    vSupport = Vec_VecEntryInt( p->vSupports, Output );
    pSupport = (unsigned *)Vec_PtrEntry( p->vSuppFun, Output );
    pSimInfo = (unsigned *)Vec_PtrEntry( p->vSim, pNode->Id );
    // generate vectors A1 and A2
    for ( w = 0; w < p->nSimWords; w++ )
    {
        p->uPatCol[w] = pSupport[w] & pPat[w] &  pSimInfo[w];
        p->uPatRow[w] = pSupport[w] & pPat[w] & ~pSimInfo[w];
    }
    // add two dimensions
    Vec_IntForEachEntry( vSupport, i, Index )
        if ( Sim_HasBit( p->uPatCol, i ) )
            Extra_BitMatrixOr( pMat, i, p->uPatRow );
    // add two dimensions
    Vec_IntForEachEntry( vSupport, i, Index )
        if ( Sim_HasBit( p->uPatRow, i ) )
            Extra_BitMatrixOr( pMat, i, p->uPatCol );
    // generate vectors B1 and B2
    for ( w = 0; w < p->nSimWords; w++ )
    {
        p->uPatCol[w] = pSupport[w] & ~pPat[w] &  pSimInfo[w];
        p->uPatRow[w] = pSupport[w] & ~pPat[w] & ~pSimInfo[w];
    }
    // add two dimensions
    Vec_IntForEachEntry( vSupport, i, Index )
        if ( Sim_HasBit( p->uPatCol, i ) )
            Extra_BitMatrixOr( pMat, i, p->uPatRow );
    // add two dimensions
    Vec_IntForEachEntry( vSupport, i, Index )
        if ( Sim_HasBit( p->uPatRow, i ) )
            Extra_BitMatrixOr( pMat, i, p->uPatCol );
}